

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O0

void __thiscall CholeskyFactor::solveLT(CholeskyFactor *this,QpVector *rhs)

{
  double dVar1;
  double dVar2;
  reference pvVar3;
  long in_RSI;
  long in_RDI;
  HighsInt j;
  double sum;
  HighsInt i;
  undefined4 local_24;
  undefined8 local_20;
  undefined4 local_14;
  
  local_14 = *(int *)(in_RSI + 4);
  while (local_14 = local_14 + -1, -1 < local_14) {
    local_20 = 0.0;
    local_24 = *(int *)(in_RSI + 4);
    while (local_24 = local_24 + -1, local_14 < local_24) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),(long)local_24)
      ;
      dVar1 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),
                          (long)(local_14 * *(int *)(in_RDI + 0x1c) + local_24));
      local_20 = dVar1 * *pvVar3 + local_20;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),(long)local_14);
    dVar1 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),
                        (long)(local_14 * *(int *)(in_RDI + 0x1c) + local_14));
    dVar2 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),(long)local_14);
    *pvVar3 = (dVar1 - local_20) / dVar2;
  }
  return;
}

Assistant:

void solveLT(QpVector& rhs) {
    for (HighsInt i = rhs.dim - 1; i >= 0; i--) {
      double sum = 0.0;
      for (HighsInt j = rhs.dim - 1; j > i; j--) {
        sum += rhs.value[j] * L[i * current_k_max + j];
      }
      rhs.value[i] = (rhs.value[i] - sum) / L[i * current_k_max + i];
    }
  }